

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vertex_sequence.h
# Opt level: O1

int __thiscall
agg::vertex_sequence<agg::vertex_dist,_6U>::close
          (vertex_sequence<agg::vertex_dist,_6U> *this,int __fd)

{
  vertex_dist **ppvVar1;
  vertex_dist *pvVar2;
  uint uVar3;
  vertex_dist *pvVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  vertex_dist t;
  vertex_dist local_48;
  
  uVar3 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
  while (pvVar4 = (vertex_dist *)(ulong)uVar3, 1 < uVar3) {
    ppvVar1 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks;
    pvVar4 = ppvVar1[uVar3 - 2 >> 6];
    uVar5 = uVar3 - 2 & 0x3f;
    pvVar2 = ppvVar1[uVar3 - 1 >> 6];
    uVar3 = uVar3 - 1 & 0x3f;
    dVar6 = pvVar2[uVar3].x - pvVar4[uVar5].x;
    dVar7 = pvVar2[uVar3].y - pvVar4[uVar5].y;
    dVar6 = dVar6 * dVar6 + dVar7 * dVar7;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    pvVar4 = pvVar4 + uVar5;
    pvVar4->dist = (double)(~-(ulong)(1e-14 < dVar6) & 0x42d6bcc41e900000 |
                           (ulong)dVar6 & -(ulong)(1e-14 < dVar6));
    if (1e-14 < dVar6) break;
    uVar3 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
    uVar5 = uVar3 - 1 & 0x3f;
    pvVar4 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks[uVar3 - 1 >> 6];
    local_48.dist = pvVar4[uVar5].dist;
    pvVar4 = pvVar4 + uVar5;
    local_48.x = pvVar4->x;
    local_48.y = pvVar4->y;
    if (uVar3 != 0) {
      (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size = uVar3 - 1;
    }
    uVar3 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
    if (uVar3 != 0) {
      (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size = uVar3 - 1;
    }
    add(this,&local_48);
    uVar3 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
  }
  if ((char)__fd != '\0') {
    uVar3 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
    while (pvVar4 = (vertex_dist *)(ulong)uVar3, 1 < uVar3) {
      ppvVar1 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks;
      pvVar4 = ppvVar1[uVar3 - 1 >> 6];
      uVar3 = uVar3 - 1 & 0x3f;
      pvVar2 = *ppvVar1;
      dVar6 = pvVar2->x - pvVar4[uVar3].x;
      dVar7 = pvVar2->y - pvVar4[uVar3].y;
      dVar6 = dVar6 * dVar6 + dVar7 * dVar7;
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      pvVar4 = pvVar4 + uVar3;
      pvVar4->dist = (double)(~-(ulong)(1e-14 < dVar6) & 0x42d6bcc41e900000 |
                             (ulong)dVar6 & -(ulong)(1e-14 < dVar6));
      if (1e-14 < dVar6) break;
      uVar3 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
      if (uVar3 != 0) {
        (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size = uVar3 - 1;
      }
      uVar3 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
    }
  }
  return (int)pvVar4;
}

Assistant:

void vertex_sequence<T, S>::close(bool closed)
    {
        while(base_type::size() > 1)
        {
            if((*this)[base_type::size() - 2]((*this)[base_type::size() - 1])) break;
            T t = (*this)[base_type::size() - 1];
            base_type::remove_last();
            modify_last(t);
        }

        if(closed)
        {
            while(base_type::size() > 1)
            {
                if((*this)[base_type::size() - 1]((*this)[0])) break;
                base_type::remove_last();
            }
        }
    }